

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

bool sentencepiece::ModelProto_SentencePiece_Type_IsValid(int value)

{
  int value_local;
  
  return value - 1U < 6;
}

Assistant:

bool ModelProto_SentencePiece_Type_IsValid(int value) {
  switch (value) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
      return true;
    default:
      return false;
  }
}